

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Legendre
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  TPZFMatrix<double> *this;
  REAL value;
  REAL ord_real;
  int ord;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  TPZFMatrix<double> *in_stack_ffffffffffffffb0;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  if (0 < in_EDI) {
    local_28 = 0x3ff0000000000000;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x100))(in_RSI,0,0,&local_28);
    local_30 = 0;
    (**(code **)(*local_20 + 0x100))(local_20,0,0,&local_30);
    if (local_c != 1) {
      (**(code **)(*local_18 + 0x100))(local_18,1,0,&local_8);
      local_38 = 0x3ff0000000000000;
      (**(code **)(*local_20 + 0x100))(local_20,0,1,&local_38);
      for (local_3c = 2; local_3c < local_c; local_3c = local_3c + 1) {
        dVar3 = (double)local_3c;
        dVar4 = ((dVar3 - 1.0) + (dVar3 - 1.0) + 1.0) * local_8;
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        dVar1 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        this = (TPZFMatrix<double> *)((dVar4 * dVar1 + -((dVar3 - 1.0) * *pdVar2)) / dVar3);
        (**(code **)(*local_18 + 0x100))(local_18,(long)local_3c,0,&stack0xffffffffffffffb0);
        in_stack_ffffffffffffffa0 = (dVar3 - 1.0) + (dVar3 - 1.0) + 1.0;
        pdVar2 = TPZFMatrix<double>::operator()
                           (this,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffffa8 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()
                           (this,(int64_t)in_stack_ffffffffffffffa8,
                            (int64_t)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffffb0 =
             (TPZFMatrix<double> *)(in_stack_ffffffffffffffa0 * in_stack_ffffffffffffffa8 + *pdVar2)
        ;
        (**(code **)(*local_20 + 0x100))(local_20,0,(long)local_3c,&stack0xffffffffffffffb0);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Legendre(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		
		// Quadratic or higher shape functions
		if (num <= 0) return;
		phi.Put(0, 0, 1.0);
		dphi.Put(0, 0, 0.0);
		
		if (num == 1) return;
		
		phi.Put(1, 0, x);
		dphi.Put(0, 1, 1.0);
		
		int ord;
		//Aqui fica diferente do Chebyshev
		REAL ord_real, value;
		for (ord = 2; ord < num; ord++)
		{
			//casting int ord to REAL ord_real
			ord_real = (REAL)ord;
			//computing the ord_th function
			value    = ( (2.0 * (ord_real - 1.0) + 1.0) * x * phi(ord - 1, 0) - (ord_real - 1.0) * phi(ord - 2 , 0) ) / (ord_real);
			phi.Put(ord, 0, value);
			
			//computing the ord_th function's derivative
			value    = (2.0 * (ord_real - 1.0) + 1.0) * phi(ord - 1, 0) + dphi(0, ord - 2);
			dphi.Put(0, ord, value);
		}
		
#ifdef PZDEBUG
		int printing = 0;
		if (printing){
			cout << "Legendre" << endl;
			for(ord = 0; ord < num; ord++)
			{
				cout << "x = " << x << endl;
				cout << "phi(" << ord << ", 0) = " << phi(ord, 0) << endl;
				cout << "dphi(0, " << ord << " = " << dphi(0, ord) << endl;
				cout << endl;
			}
		}
#endif
		
	}